

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCount.hpp
# Opt level: O1

RefCount<antlr::ParserInputState> * __thiscall
antlr::RefCount<antlr::ParserInputState>::operator=
          (RefCount<antlr::ParserInputState> *this,RefCount<antlr::ParserInputState> *other)

{
  uint *puVar1;
  Ref *pRVar2;
  Ref *pRVar3;
  
  pRVar3 = other->ref;
  if (pRVar3 == (Ref *)0x0) {
    pRVar3 = (Ref *)0x0;
  }
  else {
    pRVar3->count = pRVar3->count + 1;
  }
  pRVar2 = this->ref;
  if (pRVar2 != (Ref *)0x0) {
    puVar1 = &pRVar2->count;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      if (pRVar2->ptr != (ParserInputState *)0x0) {
        (*pRVar2->ptr->_vptr_ParserInputState[1])();
      }
      operator_delete(pRVar2,0x10);
    }
  }
  this->ref = pRVar3;
  return this;
}

Assistant:

RefCount<T>& operator=(const RefCount<T>& other)
	{
		Ref* tmp = other.ref ? other.ref->increment() : 0;
		if (ref && ref->decrement())
			delete ref;
		ref = tmp;
		return *this;
	}